

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall CLI::detail::IPV4Validator::IPV4Validator(IPV4Validator *this)

{
  anon_class_1_0_00000001 local_45 [20];
  allocator<char> local_31;
  string local_30;
  IPV4Validator *local_10;
  IPV4Validator *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"IPV4",&local_31);
  Validator::Validator(&this->super_Validator,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,local_45);
  return;
}

Assistant:

IPV4Validator() : Validator("IPV4") {
        func_ = [](std::string &ip_addr) {
            auto result = CLI::detail::split(ip_addr, '.');
            if(result.size() != 4) {
                return std::string("Invalid IPV4 address must have four parts (") + ip_addr + ')';
            }
            int num;
            for(const auto &var : result) {
                bool retval = detail::lexical_cast(var, num);
                if(!retval) {
                    return std::string("Failed parsing number (") + var + ')';
                }
                if(num < 0 || num > 255) {
                    return std::string("Each IP number must be between 0 and 255 ") + var;
                }
            }
            return std::string();
        };
    }